

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::JUnitReporter::test_case_start(JUnitReporter *this,TestCaseData *in)

{
  char *__s;
  TestCaseData *file;
  timeval t;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  file = in;
  if ((in->m_file).field_0.buf[0x17] < '\0') {
    file = (TestCaseData *)(in->m_file).field_0.data.ptr;
  }
  __s = skipPathFromFilename((char *)file);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,in->m_name,&local_52);
  JUnitTestCaseData::add(&this->testCaseData,&local_50,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  gettimeofday((timeval *)&local_50,(__timezone_ptr_t)0x0);
  (this->timer).m_ticks = (long)local_50._M_dataplus._M_p * 1000000 + local_50._M_string_length;
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
            timer.start();
        }